

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_133c8f4::QChildProcess::CharPointerList::updatePointers
          (CharPointerList *this,qsizetype count)

{
  char *pcVar1;
  char *pcVar2;
  type ppcVar3;
  size_t __i;
  
  pcVar1 = (this->data).d.ptr;
  __i = 0;
  if (count < 1) {
    count = __i;
  }
  for (; count != __i; __i = __i + 1) {
    ppcVar3 = std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::operator[]
                        (&this->pointers,__i);
    pcVar2 = *ppcVar3;
    ppcVar3 = std::unique_ptr<char_*[],_std::default_delete<char_*[]>_>::operator[]
                        (&this->pointers,__i);
    *ppcVar3 = pcVar2 + (long)pcVar1;
  }
  return;
}

Assistant:

void QChildProcess::CharPointerList::updatePointers(qsizetype count)
{
    char *const base = const_cast<char *>(data.constBegin());
    for (qsizetype i = 0; i < count; ++i)
        pointers[i] = base + qptrdiff(pointers[i]);
}